

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__decode_jpeg_header(stbi__jpeg *z,int scan)

{
  int a;
  ulong *puVar1;
  stbi__uint32 b;
  stbi__context *s;
  stbi_uc sVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  stbi__uint32 sVar6;
  uint uVar7;
  void *pvVar8;
  long lVar9;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  int *piVar14;
  int iVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int local_70;
  
  z->jfif = 0;
  z->app14_color_transform = -1;
  z->marker = 0xff;
  sVar2 = stbi__get_marker(z);
  if (sVar2 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  bVar3 = stbi__get_marker(z);
  while ((bVar3 != 0xc2 && ((bVar3 & 0xfe) != 0xc0))) {
    iVar4 = stbi__process_marker(z,(uint)bVar3);
    if (iVar4 == 0) {
      return 0;
    }
    while (bVar3 = stbi__get_marker(z), bVar3 == 0xff) {
      iVar4 = stbi__at_eof(z->s);
      if (iVar4 != 0) {
        stbi__g_failure_reason = "no SOF";
        return 0;
      }
    }
  }
  z->progressive = (uint)(bVar3 == 0xc2);
  s = z->s;
  uVar5 = stbi__get16be(s);
  if (10 < uVar5) {
    sVar2 = stbi__get8(s);
    if (sVar2 != '\b') {
      stbi__g_failure_reason = "only 8-bit";
      return 0;
    }
    sVar6 = stbi__get16be(s);
    s->img_y = sVar6;
    if (sVar6 == 0) {
      stbi__g_failure_reason = "no header height";
      return 0;
    }
    sVar6 = stbi__get16be(s);
    s->img_x = sVar6;
    if (sVar6 == 0) {
      stbi__g_failure_reason = "0 width";
      return 0;
    }
    bVar3 = stbi__get8(s);
    if ((4 < bVar3) || ((0x1aU >> (bVar3 & 0x1f) & 1) == 0)) {
      stbi__g_failure_reason = "bad component count";
      return 0;
    }
    s->img_n = (uint)bVar3;
    for (lVar11 = 0; (ulong)(uint)bVar3 * 0x60 - lVar11 != 0; lVar11 = lVar11 + 0x60) {
      *(undefined8 *)((long)&z->img_comp[0].data + lVar11) = 0;
      *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar11) = 0;
    }
    if (uVar5 == (uint)bVar3 * 3 + 8) {
      z->rgb = 0;
      piVar14 = &z->img_comp[0].tq;
      lVar11 = 0;
      while (uVar5 = s->img_n, lVar11 < (int)uVar5) {
        bVar3 = stbi__get8(s);
        ((anon_struct_96_18_0d0905d3 *)(piVar14 + -3))->id = (uint)bVar3;
        if ((s->img_n == 3) &&
           (bVar3 == (&stbi__process_frame_header(stbi__jpeg*,int)::rgb)[lVar11])) {
          z->rgb = z->rgb + 1;
        }
        bVar3 = stbi__get8(s);
        piVar14[-2] = (uint)(bVar3 >> 4);
        if ((byte)(bVar3 + 0xb0) < 0xc0) {
          stbi__g_failure_reason = "bad H";
          return 0;
        }
        piVar14[-1] = bVar3 & 0xf;
        if ((bVar3 & 0xf) - 5 < 0xfffffffc) {
          stbi__g_failure_reason = "bad V";
          return 0;
        }
        bVar3 = stbi__get8(s);
        lVar11 = lVar11 + 1;
        *piVar14 = (uint)bVar3;
        piVar14 = piVar14 + 0x18;
        if (3 < bVar3) {
          stbi__g_failure_reason = "bad TQ";
          return 0;
        }
      }
      if (scan != 0) {
        return 1;
      }
      sVar6 = s->img_x;
      b = s->img_y;
      iVar4 = stbi__mad3sizes_valid(sVar6,b,uVar5,0);
      if (iVar4 == 0) {
        stbi__g_failure_reason = "too large";
        return 0;
      }
      auVar17._8_4_ = 1;
      auVar17._0_8_ = 0x100000001;
      auVar17._12_4_ = 1;
      lVar9 = (ulong)(~((int)uVar5 >> 0x1f) & uVar5) * 0x60;
      lVar11 = 0;
      while (lVar9 - lVar11 != 0) {
        puVar1 = (ulong *)((long)&z->img_comp[0].h + lVar11);
        lVar11 = lVar11 + 0x60;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = *puVar1;
        auVar17 = vpmaxsd_avx(auVar18,auVar17);
      }
      uVar16 = auVar17._0_4_;
      uVar12 = auVar17._4_4_;
      z->img_h_max = (int)auVar17._0_8_;
      z->img_v_max = (int)((ulong)auVar17._0_8_ >> 0x20);
      lVar11 = 0;
      z->img_mcu_w = uVar16 * 8;
      z->img_mcu_h = uVar12 * 8;
      uVar5 = ((sVar6 - 1) + uVar16 * 8) / (uVar16 * 8);
      z->img_mcu_x = uVar5;
      uVar7 = ((b - 1) + uVar12 * 8) / (uVar12 * 8);
      z->img_mcu_y = uVar7;
      local_70 = 1;
      while( true ) {
        if (lVar9 == lVar11) {
          return 1;
        }
        iVar13 = *(int *)((long)&z->img_comp[0].h + lVar11);
        iVar10 = *(int *)((long)&z->img_comp[0].v + lVar11);
        *(uint *)((long)&z->img_comp[0].x + lVar11) = (iVar13 * sVar6 + (uVar16 - 1)) / uVar16;
        iVar13 = iVar13 * uVar5;
        iVar15 = iVar10 * uVar7;
        iVar4 = iVar15 * 8;
        a = iVar13 * 8;
        *(uint *)((long)&z->img_comp[0].y + lVar11) = (iVar10 * b + (uVar12 - 1)) / uVar12;
        *(int *)((long)&z->img_comp[0].w2 + lVar11) = a;
        *(int *)((long)&z->img_comp[0].h2 + lVar11) = iVar4;
        pvVar8 = stbi__malloc_mad2(a,iVar4,0xf);
        *(undefined8 *)((long)&z->img_comp[0].coeff + lVar11) = 0;
        *(undefined1 (*) [16])((long)&z->img_comp[0].raw_coeff + lVar11) = (undefined1  [16])0x0;
        *(void **)((long)&z->img_comp[0].raw_data + lVar11) = pvVar8;
        iVar10 = extraout_EDX;
        if (pvVar8 == (void *)0x0) break;
        *(ulong *)((long)&z->img_comp[0].data + lVar11) = (long)pvVar8 + 0xfU & 0xfffffffffffffff0;
        if (z->progressive != 0) {
          *(int *)((long)&z->img_comp[0].coeff_w + lVar11) = iVar13;
          *(int *)((long)&z->img_comp[0].coeff_h + lVar11) = iVar15;
          pvVar8 = stbi__malloc_mad3(a,iVar4,2,0xf);
          *(void **)((long)&z->img_comp[0].raw_coeff + lVar11) = pvVar8;
          iVar10 = extraout_EDX_00;
          if (pvVar8 == (void *)0x0) break;
          *(ulong *)((long)&z->img_comp[0].coeff + lVar11) =
               (long)pvVar8 + 0xfU & 0xfffffffffffffff0;
        }
        local_70 = local_70 + 1;
        lVar11 = lVar11 + 0x60;
      }
      stbi__g_failure_reason = "outofmem";
      stbi__free_jpeg_components(z,local_70,iVar10);
      return 0;
    }
  }
  stbi__g_failure_reason = "bad SOF len";
  return 0;
}

Assistant:

static int stbi__decode_jpeg_header(stbi__jpeg *z, int scan)
{
   int m;
   z->jfif = 0;
   z->app14_color_transform = -1; // valid values are 0,1,2
   z->marker = STBI__MARKER_none; // initialize cached marker to empty
   m = stbi__get_marker(z);
   if (!stbi__SOI(m)) return stbi__err("no SOI","Corrupt JPEG");
   if (scan == STBI__SCAN_type) return 1;
   m = stbi__get_marker(z);
   while (!stbi__SOF(m)) {
      if (!stbi__process_marker(z,m)) return 0;
      m = stbi__get_marker(z);
      while (m == STBI__MARKER_none) {
         // some files have extra padding after their blocks, so ok, we'll scan
         if (stbi__at_eof(z->s)) return stbi__err("no SOF", "Corrupt JPEG");
         m = stbi__get_marker(z);
      }
   }
   z->progressive = stbi__SOF_progressive(m);
   if (!stbi__process_frame_header(z, scan)) return 0;
   return 1;
}